

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.cpp
# Opt level: O0

VectorXd __thiscall LidarMeasurement::InitializeState(LidarMeasurement *this,int n)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  int in_EDX;
  DenseIndex extraout_RDX;
  undefined4 in_register_00000034;
  long lVar4;
  VectorXd VVar5;
  Scalar local_28;
  undefined1 local_1d;
  long lStack_18;
  int n_local;
  LidarMeasurement *this_local;
  VectorXd *x;
  
  lVar4 = CONCAT44(in_register_00000034,n);
  local_1d = 0;
  lStack_18 = lVar4;
  this_local = this;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,(long)in_EDX);
  local_28 = 0.1;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::fill
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,&local_28);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)(lVar4 + 0x18),0
                     );
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,0);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)(lVar4 + 0x18),1
                     );
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,1);
  *pSVar3 = dVar1;
  VVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

VectorXd LidarMeasurement::InitializeState(int n) const {

    VectorXd x(n);
    // initialize the state vector
    x.fill(0.1);
    x(0) = measurements_[0];
    x(1) = measurements_[1];
    //x(0) = (fabs(measurements_[0]) < 0.01) ? 0.01 : measurements_[0];
    //x(1) = (fabs(measurements_[1]) < 0.01) ? 0.01 : measurements_[1];
    return x;
}